

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fClippingTests.cpp
# Opt level: O0

vector<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
* __thiscall
deqp::gles3::Functional::anon_unknown_0::LineRenderTestCase::convertToColoredLines
          (vector<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
           *__return_storage_ptr__,LineRenderTestCase *this,ColorlessLineData *linesBegin,
          ColorlessLineData *linesEnd)

{
  Vector<float,_4> local_a4;
  Vector<float,_4> local_94;
  undefined1 auStack_78 [8];
  ColoredLineData r;
  ColorlessLineData *it;
  ColorlessLineData *linesEnd_local;
  ColorlessLineData *linesBegin_local;
  LineRenderTestCase *this_local;
  vector<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  *ret;
  
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
  ::vector(__return_storage_ptr__);
  for (r.c1.m_data._8_8_ = linesBegin; (ColorlessLineData *)r.c1.m_data._8_8_ != linesEnd;
      r.c1.m_data._8_8_ = r.c1.m_data._8_8_ + 0x20) {
    ColoredLineData::ColoredLineData((ColoredLineData *)auStack_78);
    auStack_78 = *(undefined1 (*) [8])r.c1.m_data._8_8_;
    r.p0.m_data._0_8_ = *(undefined8 *)(r.c1.m_data._8_8_ + 8);
    tcu::Vector<float,_4>::Vector(&local_94,1.0,1.0,1.0,1.0);
    r.p0.m_data[2] = local_94.m_data[0];
    r.p0.m_data[3] = local_94.m_data[1];
    r.c0.m_data[0] = local_94.m_data[2];
    r.c0.m_data[1] = local_94.m_data[3];
    r.c0.m_data._8_8_ = *(undefined8 *)(r.c1.m_data._8_8_ + 0x10);
    r.p1.m_data._0_8_ = *(undefined8 *)(r.c1.m_data._8_8_ + 0x18);
    tcu::Vector<float,_4>::Vector(&local_a4,1.0,1.0,1.0,1.0);
    r.p1.m_data[2] = local_a4.m_data[0];
    r.p1.m_data[3] = local_a4.m_data[1];
    r.c1.m_data[0] = local_a4.m_data[2];
    r.c1.m_data[1] = local_a4.m_data[3];
    std::
    vector<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::LineRenderTestCase::ColoredLineData>_>
    ::push_back(__return_storage_ptr__,(value_type *)auStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<LineRenderTestCase::ColoredLineData> LineRenderTestCase::convertToColoredLines(const ColorlessLineData* linesBegin, const ColorlessLineData* linesEnd)
{
	std::vector<ColoredLineData> ret;

	for (const ColorlessLineData* it = linesBegin; it != linesEnd; ++it)
	{
		ColoredLineData r;

		r.p0 = (*it).p0;
		r.c0 = tcu::Vec4(1, 1, 1, 1);
		r.p1 = (*it).p1;
		r.c1 = tcu::Vec4(1, 1, 1, 1);

		ret.push_back(r);
	}

	return ret;
}